

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O3

void pzshape::TPZShapePiram::TransformDerivativeFromFaceToPiram
               (int face,int num,TPZFMatrix<double> *dphi)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < num) {
    lVar8 = (long)face * 0x30;
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    uVar7 = 0;
    do {
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar3 <= (long)uVar7 || lVar2 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4 = dphi->fElem;
      lVar5 = lVar2 * uVar7;
      if (lVar3 <= (long)uVar7 || lVar2 < 2) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar2 < 3) || (lVar3 <= (long)uVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar5 + 2] =
           *(double *)(gFaceTrans3dPiram2d + lVar8 + 0x10) * pdVar4[lVar5] +
           *(double *)(gFaceTrans3dPiram2d + lVar8 + 0x28) * pdVar4[lVar5 + 1];
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar3 <= (long)uVar7 || lVar2 < 2) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dVar1 = pdVar4[lVar5 + 1];
      if (lVar3 <= (long)uVar7 || lVar2 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar2 < 2) || (lVar3 <= (long)uVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = lVar2 * uVar7;
      if ((lVar2 < 2) || (lVar3 <= (long)uVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar6 + 1] =
           *(double *)(gFaceTrans3dPiram2d + lVar8 + 8) * pdVar4[lVar5] +
           *(double *)(gFaceTrans3dPiram2d + lVar8 + 0x20) * pdVar4[lVar6 + 1];
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar3 <= (long)uVar7 || lVar2 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar2 < 1) || (lVar3 <= (long)uVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar2 * uVar7] =
           *(double *)(gFaceTrans3dPiram2d + lVar8) * pdVar4[lVar6] +
           dVar1 * *(double *)(gFaceTrans3dPiram2d + lVar8 + 0x18);
      uVar7 = uVar7 + 1;
    } while ((uint)num != uVar7);
  }
  return;
}

Assistant:

void TPZShapePiram::TransformDerivativeFromFaceToPiram(int face,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gFaceTrans3dPiram2d[face][0][2]*dphi(0,j)+gFaceTrans3dPiram2d[face][1][2]*dphi(1,j);
			REAL dphi1j = dphi(1,j);
			dphi(1,j) = gFaceTrans3dPiram2d[face][0][1]*dphi(0,j)+gFaceTrans3dPiram2d[face][1][1]*dphi(1,j);
			dphi(0,j) = gFaceTrans3dPiram2d[face][0][0]*dphi(0,j)+gFaceTrans3dPiram2d[face][1][0]*dphi1j;//dphi(1,j);
		}
	}